

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
sequence<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>,mpl_::bool_<true>>>
          (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<true>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *xpr)

{
  width wVar1;
  dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<true>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pdVar2;
  intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<true>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RSI;
  simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<true>_>
  *in_RDI;
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  intrusive_ptr<const_boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  intrusive_ptr<const_boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_18;
  intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<true>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_10;
  
  (in_RDI->xpr_).
  super_string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>
  .str_._M_dataplus = (_Alloc_hider)0x1;
  local_10 = in_RSI;
  intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<true>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator->(in_RSI);
  wVar1 = simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<true>_>
          ::get_width(in_RDI);
  (in_RDI->xpr_).
  super_string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>
  .str_._M_string_length = wVar1.value_;
  *(undefined4 *)
   &(in_RDI->xpr_).
    super_string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>
    .str_.field_2 = 2;
  this_00 = (shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&(in_RDI->xpr_).
                       super_string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>
                       .str_.field_2 + 8);
  intrusive_ptr<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>const>
  ::
  intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>,mpl_::bool_<true>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
            (&local_18,local_10);
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::shared_matchable(this_00,(matchable_ptr *)in_RDI);
  intrusive_ptr<const_boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~intrusive_ptr(in_stack_ffffffffffffffd0);
  pdVar2 = intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<true>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator->(local_10);
  (in_RDI->xpr_).
  super_string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>
  .end_ = (char_type *)&pdVar2->next_;
  intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::intrusive_ptr((intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&in_RDI->min_);
  in_RDI->width_ = 0;
  return;
}

Assistant:

sequence(intrusive_ptr<dynamic_xpression<Matcher, BidiIter> > const &xpr)
      : pure_(Matcher::pure)
      , width_(xpr->Matcher::get_width())
      , quant_(static_cast<quant_enum>(Matcher::quant))
      , head_(xpr)
      , tail_(&xpr->next_)
      , alt_end_xpr_()
      , alternates_(0)
    {
    }